

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

const_iterator * __thiscall
compressed_sparse_matrix<int>::cbegin
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<int> *this,size_t index)

{
  _Elt_pointer piVar1;
  _Map_pointer ppiVar2;
  reference puVar3;
  _Self local_38;
  
  if (index == 0) {
    piVar1 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
    __return_storage_ptr__->_M_cur =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_cur;
    __return_storage_ptr__->_M_first = piVar1;
    ppiVar2 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    __return_storage_ptr__->_M_last =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_last;
    __return_storage_ptr__->_M_node = ppiVar2;
  }
  else {
    local_38._M_cur =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_cur;
    local_38._M_first =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_first;
    local_38._M_last =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_last;
    local_38._M_node =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_node;
    puVar3 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                       (&(this->bounds).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start,index - 1);
    std::operator+(__return_storage_ptr__,&local_38,*puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<ValueType>::const_iterator cbegin(size_t index) const {
		assert(index < size());
		return index == 0 ? entries.cbegin() : entries.cbegin() + bounds[index - 1];
	}